

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ExtensionSet::RemoveLast(ExtensionSet *this,int number)

{
  CppType CVar1;
  Extension *pEVar2;
  LogMessage LStack_18;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x368,"extension != nullptr");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_18,(char (*) [38])"Index out-of-bounds (field is empty).");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_18);
  }
  if (pEVar2->is_repeated == false) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x369,"extension->is_repeated");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_18);
  }
  CVar1 = anon_unknown_59::cpp_type(pEVar2->type);
  switch(CVar1) {
  case CPPTYPE_INT32:
  case CPPTYPE_ENUM:
    RepeatedField<int>::RemoveLast((RepeatedField<int> *)pEVar2->field_0);
    return;
  case CPPTYPE_INT64:
    RepeatedField<long>::RemoveLast((RepeatedField<long> *)pEVar2->field_0);
    return;
  case CPPTYPE_UINT32:
    RepeatedField<unsigned_int>::RemoveLast((RepeatedField<unsigned_int> *)pEVar2->field_0);
    return;
  case CPPTYPE_UINT64:
    RepeatedField<unsigned_long>::RemoveLast((RepeatedField<unsigned_long> *)pEVar2->field_0);
    return;
  case CPPTYPE_DOUBLE:
    RepeatedField<double>::RemoveLast((RepeatedField<double> *)pEVar2->field_0);
    return;
  case CPPTYPE_FLOAT:
    RepeatedField<float>::RemoveLast((RepeatedField<float> *)pEVar2->field_0);
    return;
  case CPPTYPE_BOOL:
    RepeatedField<bool>::RemoveLast((RepeatedField<bool> *)pEVar2->field_0);
    return;
  case CPPTYPE_STRING:
    RepeatedPtrFieldBase::
    RemoveLast<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
              ((RepeatedPtrFieldBase *)pEVar2->field_0);
    return;
  case CPPTYPE_MESSAGE:
    RepeatedPtrFieldBase::
    RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
              ((RepeatedPtrFieldBase *)pEVar2->field_0);
    return;
  default:
    return;
  }
}

Assistant:

ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) {
  const auto* const_this = this;
  return const_cast<ExtensionSet::Extension*>(const_this->FindOrNull(key));
}